

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jutils.c
# Opt level: O1

void jcopy_sample_rows(JSAMPARRAY input_array,int source_row,JSAMPARRAY output_array,int dest_row,
                      int num_rows,JDIMENSION num_cols)

{
  int iVar1;
  int row;
  long lVar2;
  
  if (0 < num_rows) {
    iVar1 = num_rows + 1;
    lVar2 = 0;
    do {
      memcpy(*(void **)((long)output_array + lVar2 + (long)dest_row * 8),
             *(void **)((long)input_array + lVar2 + (long)source_row * 8),(ulong)num_cols);
      iVar1 = iVar1 + -1;
      lVar2 = lVar2 + 8;
    } while (1 < iVar1);
  }
  return;
}

Assistant:

GLOBAL(void)
jcopy_sample_rows(JSAMPARRAY input_array, int source_row,
                  JSAMPARRAY output_array, int dest_row, int num_rows,
                  JDIMENSION num_cols)
/* Copy some rows of samples from one place to another.
 * num_rows rows are copied from input_array[source_row++]
 * to output_array[dest_row++]; these areas may overlap for duplication.
 * The source and destination arrays must be at least as wide as num_cols.
 */
{
  register JSAMPROW inptr, outptr;
  register size_t count = (size_t)(num_cols * sizeof(JSAMPLE));
  register int row;

  input_array += source_row;
  output_array += dest_row;

  for (row = num_rows; row > 0; row--) {
    inptr = *input_array++;
    outptr = *output_array++;
    MEMCOPY(outptr, inptr, count);
  }
}